

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node_iterator * __thiscall pugi::xml_node_iterator::operator--(xml_node_iterator *this)

{
  xml_node_iterator *in_RDI;
  xml_node_struct *local_10;
  
  if ((in_RDI->_wrap)._root == (xml_node_struct *)0x0) {
    local_10 = (xml_node_struct *)xml_node::last_child(&in_RDI->_wrap);
  }
  else {
    local_10 = (xml_node_struct *)xml_node::previous_sibling(&in_RDI->_wrap);
  }
  (in_RDI->_wrap)._root = local_10;
  return in_RDI;
}

Assistant:

PUGI_IMPL_FN xml_node_iterator& xml_node_iterator::operator--()
	{
		_wrap = _wrap._root ? _wrap.previous_sibling() : _parent.last_child();
		return *this;
	}